

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# palette.c
# Opt level: O1

int PaletteSort(PaletteSorting method,WebPPicture *pic,uint32_t *palette_sorted,uint32_t num_colors,
               uint32_t *palette)

{
  int *piVar1;
  void *pvVar2;
  uint32_t *puVar3;
  void *ptr;
  void *ptr_00;
  void *pvVar4;
  uint32_t *puVar5;
  int iVar6;
  uint32_t uVar7;
  ulong uVar8;
  ulong uVar9;
  uint32_t *idx_map_00;
  byte bVar10;
  uint uVar11;
  void *pvVar12;
  long lVar13;
  uint32_t uVar14;
  ulong uVar15;
  long lVar16;
  ulong uVar17;
  uint uVar18;
  int iVar19;
  uint uVar20;
  byte bVar21;
  byte bVar22;
  uint uVar23;
  uint32_t uVar24;
  uint32_t uVar25;
  uint uVar26;
  byte bVar27;
  uint uVar28;
  uint *puVar29;
  int iVar30;
  uint uVar31;
  bool bVar32;
  uint32_t palette_sorted_1 [256];
  uint32_t idx_map [256];
  undefined4 local_c38;
  undefined8 uStack_840;
  uint32_t local_838;
  uint auStack_834 [513];
  
  uVar17 = (ulong)num_colors;
  uVar9 = (ulong)num_colors;
  if (method == kModifiedZeng) {
    if (1 < num_colors) {
      ptr = WebPSafeCalloc((ulong)(num_colors * num_colors),4);
      if (ptr == (void *)0x0) {
        return 0;
      }
      puVar29 = pic->argb;
      uVar11 = *puVar29;
      memset(&local_838,0,0x400);
      ptr_00 = WebPSafeMalloc((long)pic->width * 2,4);
      if (ptr_00 == (void *)0x0) {
        WebPSafeFree(ptr);
        return 0;
      }
      iVar30 = pic->width;
      idx_map_00 = &local_838;
      PrepareMapToPalette(palette_sorted,num_colors,&local_c38,idx_map_00);
      if (0 < pic->height) {
        uVar11 = ~uVar11;
        uVar14 = 0;
        iVar6 = 0;
        pvVar2 = (void *)((long)ptr_00 + (long)iVar30 * 4);
        pvVar12 = ptr_00;
        do {
          pvVar4 = pvVar2;
          if (0 < pic->width) {
            lVar13 = 0;
            do {
              uVar20 = puVar29[lVar13];
              if (uVar20 != uVar11) {
                if (local_c38 == uVar20) {
                  lVar16 = 0;
                }
                else {
                  uVar7 = 0;
                  uVar14 = num_colors;
                  do {
                    uVar24 = (int)(uVar14 + uVar7) >> 1;
                    uVar11 = (&local_c38)[(int)uVar24];
                    bVar32 = uVar11 == uVar20;
                    uVar25 = uVar7;
                    if (uVar11 < uVar20) {
                      uVar25 = uVar24;
                    }
                    if (bVar32) {
                      uVar25 = uVar7;
                    }
                    uVar7 = uVar25;
                    if (uVar11 >= uVar20 && !bVar32) {
                      uVar14 = uVar24;
                    }
                  } while (!bVar32);
                  lVar16 = (long)(int)uVar24;
                }
                uVar14 = (&local_838)[lVar16];
                uVar11 = uVar20;
              }
              *(uint32_t *)((long)pvVar4 + lVar13 * 4) = uVar14;
              if ((lVar13 != 0) &&
                 (uVar7 = *(uint32_t *)((long)pvVar4 + lVar13 * 4 + -4), uVar14 != uVar7)) {
                piVar1 = (int *)((long)ptr + (ulong)(uVar14 * num_colors + uVar7) * 4);
                *piVar1 = *piVar1 + 1;
                piVar1 = (int *)((long)ptr + (ulong)(uVar7 * num_colors + uVar14) * 4);
                *piVar1 = *piVar1 + 1;
              }
              if ((iVar6 != 0) &&
                 (uVar7 = *(uint32_t *)((long)pvVar12 + lVar13 * 4), uVar14 != uVar7)) {
                piVar1 = (int *)((long)ptr + (ulong)(uVar14 * num_colors + uVar7) * 4);
                *piVar1 = *piVar1 + 1;
                piVar1 = (int *)((long)ptr + (ulong)(uVar7 * num_colors + uVar14) * 4);
                *piVar1 = *piVar1 + 1;
              }
              lVar13 = lVar13 + 1;
            } while (lVar13 < pic->width);
          }
          puVar29 = puVar29 + pic->argb_stride;
          iVar6 = iVar6 + 1;
          pvVar2 = pvVar12;
          pvVar12 = pvVar4;
        } while (iVar6 < pic->height);
      }
      WebPSafeFree(ptr_00);
      uVar18 = local_c38 >> 0x10;
      lVar13 = 0;
      uVar20 = 0;
      uVar23 = 0;
      uVar11 = 0;
      do {
        uVar17 = 0;
        uVar28 = 0;
        do {
          uVar28 = uVar28 + *(int *)((long)ptr + (ulong)(uint)((int)lVar13 + (int)uVar17) * 4);
          uVar17 = uVar17 + 1;
        } while (uVar9 != uVar17);
        uVar20 = uVar20 & 0xff;
        if (uVar11 < uVar28) {
          uVar11 = uVar28;
          uVar20 = uVar23;
        }
        uVar23 = uVar23 + 1;
        lVar13 = lVar13 + uVar9;
      } while (uVar23 != num_colors);
      uVar28 = uVar20 & 0xff;
      uVar17 = 0;
      uVar11 = 0;
      uVar23 = 0;
      do {
        uVar31 = *(uint *)((long)ptr + (ulong)(uVar28 * num_colors + (uint)uVar17) * 4);
        uVar11 = uVar11 & 0xff;
        if (uVar23 < uVar31) {
          uVar23 = uVar31;
          uVar11 = (uint)uVar17;
        }
        uVar17 = uVar17 + 1;
      } while (uVar9 != uVar17);
      local_c38._0_2_ = CONCAT11((char)uVar11,(char)uVar20);
      local_c38 = CONCAT22((short)uVar18,(undefined2)local_c38);
      if (num_colors - 2 == 0) {
        uVar9 = 0;
      }
      else {
        local_838._0_1_ = 0;
        auStack_834[0] = 0;
        uVar11 = uVar11 & 0xff;
        uVar9 = (ulong)uVar11;
        uVar17 = 0;
        uVar18 = 0;
        do {
          if (((uVar20 & 0xff) != uVar17) && (uVar9 != uVar17)) {
            uVar15 = (ulong)uVar18;
            *(char *)(&local_838 + uVar15 * 2) = (char)uVar17;
            uVar23 = *(int *)((long)ptr + (ulong)uVar11 * 4) +
                     *(int *)((long)ptr + (ulong)uVar28 * 4);
            auStack_834[uVar15 * 2] = uVar23;
            if (idx_map_00[1] < uVar23) {
              idx_map_00 = &local_838 + uVar15 * 2;
            }
            uVar18 = uVar18 + 1;
          }
          uVar17 = uVar17 + 1;
          uVar11 = uVar11 + num_colors;
          uVar28 = uVar28 + num_colors;
        } while (num_colors + (num_colors == 0) != uVar17);
        uVar17 = (ulong)(num_colors - 3);
        uVar15 = (ulong)(num_colors - 2);
        uVar9 = 0;
        iVar30 = 1;
        uVar11 = 1;
        do {
          bVar22 = (byte)*idx_map_00;
          uVar18 = uVar11 + 1;
          uVar8 = uVar9 % (ulong)num_colors;
          uVar20 = uVar18;
          if ((uint)uVar8 != uVar18) {
            uVar14 = (uint32_t)uVar9;
            iVar19 = 0;
            iVar6 = iVar30;
            uVar7 = uVar14;
            do {
              uVar7 = uVar7 + 1;
              iVar19 = iVar19 + *(int *)((long)ptr +
                                        (ulong)((uint)*(byte *)((long)&local_c38 + uVar8) +
                                               bVar22 * num_colors) * 4) * iVar6;
              uVar8 = (ulong)uVar7 % (ulong)num_colors;
              iVar6 = iVar6 + -2;
            } while ((uint)uVar8 != uVar18);
            if (0 < iVar19) {
              if (uVar14 == 0) {
                uVar14 = num_colors;
              }
              uVar18 = uVar14 - 1;
              uVar9 = (ulong)uVar18;
              uVar20 = uVar11;
            }
          }
          uVar11 = uVar20;
          *(byte *)((long)&local_c38 + (ulong)uVar18) = bVar22;
          *(undefined8 *)idx_map_00 = (&uStack_840)[uVar15];
          idx_map_00 = &local_838;
          uVar15 = uVar15 - 1;
          if (uVar15 != 0) {
            puVar5 = &local_838;
            uVar8 = 0;
            idx_map_00 = puVar5;
            do {
              uVar20 = puVar5[1] +
                       *(int *)((long)ptr + (ulong)((uint)(byte)*puVar5 + bVar22 * num_colors) * 4);
              puVar5[1] = uVar20;
              puVar3 = puVar5;
              if (uVar20 <= idx_map_00[1]) {
                puVar3 = idx_map_00;
              }
              idx_map_00 = puVar3;
              uVar8 = uVar8 + 1;
              puVar5 = puVar5 + 2;
            } while (uVar17 != uVar8);
          }
          uVar17 = uVar17 - 1;
          iVar30 = iVar30 + 1;
        } while (uVar15 != 0);
      }
      WebPSafeFree(ptr);
      uVar17 = 0;
      do {
        palette[uVar17] =
             palette_sorted
             [*(byte *)((long)&local_c38 +
                       (ulong)(uint)((int)uVar9 + (int)uVar17) % (ulong)num_colors)];
        uVar17 = uVar17 + 1;
      } while (num_colors + (num_colors == 0) != uVar17);
    }
  }
  else if (method == kMinimizeDelta) {
    memcpy(palette,palette_sorted,(long)(int)num_colors << 2);
    if ((int)num_colors < 1) {
      bVar22 = 0;
    }
    else {
      uVar15 = 0;
      bVar22 = 0;
      uVar11 = 0;
      do {
        uVar20 = palette_sorted[uVar15];
        uVar18 = (uVar20 | 0xff00) - (uVar11 & 0xff00ff);
        uVar23 = uVar20 - (uVar11 & 0xff00);
        uVar11 = uVar18 >> 0x10 & 0xff;
        bVar27 = 2 - (uVar11 < 0x80);
        if (uVar11 == 0) {
          bVar27 = (byte)(uVar18 >> 0x10);
        }
        uVar11 = uVar23 >> 8 & 0xff;
        bVar10 = (0x7f < uVar11) * '\b' + 8;
        if (uVar11 == 0) {
          bVar10 = (byte)(uVar23 >> 8);
        }
        bVar21 = 0x80;
        if ((uVar18 & 0xff) < 0x80) {
          bVar21 = 0x40;
        }
        if ((uVar18 & 0xff) == 0) {
          bVar21 = (byte)uVar18;
        }
        bVar22 = bVar21 | bVar22 | bVar27 | bVar10;
        uVar15 = uVar15 + 1;
        uVar11 = uVar20;
      } while (uVar9 != uVar15);
    }
    if ((bVar22 * '\x02' & bVar22) == 0) {
      return 1;
    }
    if ((0x11 < (int)num_colors) && (*palette == 0)) {
      uVar17 = (ulong)(num_colors - 1);
      uVar14 = palette[uVar17];
      palette[uVar17] = 0;
      *palette = uVar14;
    }
    if ((int)uVar17 < 1) {
      return 1;
    }
    uVar9 = 0;
    uVar11 = 0;
    do {
      uVar20 = 0xffffffff;
      uVar8 = uVar9 & 0xffffffff;
      uVar15 = uVar9;
      do {
        uVar28 = (palette[uVar15] | 0xff0000) - (uVar11 & 0xff00ff00);
        uVar31 = (palette[uVar15] | 0xff00) - (uVar11 & 0xff00ff);
        uVar23 = uVar31 & 0xff;
        uVar18 = 0x100 - uVar23;
        if (uVar23 < 0x81) {
          uVar18 = uVar23;
        }
        uVar26 = uVar28 >> 8 & 0xff;
        uVar23 = 0x100 - uVar26;
        if (uVar26 < 0x81) {
          uVar23 = uVar26;
        }
        uVar26 = uVar31 >> 0x10 & 0xff;
        uVar31 = 0x100 - uVar26;
        if (uVar26 < 0x81) {
          uVar31 = uVar26;
        }
        uVar26 = 0x100 - (uVar28 >> 0x18);
        if (uVar28 < 0x81000000) {
          uVar26 = uVar28 >> 0x18;
        }
        uVar26 = uVar26 + (uVar31 + uVar23 + uVar18) * 9;
        if (uVar26 < uVar20) {
          uVar8 = uVar15 & 0xffffffff;
        }
        if (uVar26 <= uVar20) {
          uVar20 = uVar26;
        }
        uVar15 = uVar15 + 1;
      } while (uVar17 != uVar15);
      uVar11 = palette[(int)uVar8];
      palette[(int)uVar8] = palette[uVar9];
      palette[uVar9] = uVar11;
      uVar9 = uVar9 + 1;
    } while (uVar9 != uVar17);
  }
  else {
    if (method != kSortedDefault) {
      return 0;
    }
    if ((num_colors < 0x12) || (*palette_sorted != 0)) {
      memcpy(palette,palette_sorted,uVar9 << 2);
    }
    else {
      memcpy(palette,palette_sorted + 1,(ulong)(num_colors - 1) * 4);
      palette[num_colors - 1] = 0;
    }
  }
  return 1;
}

Assistant:

int PaletteSort(PaletteSorting method, const struct WebPPicture* const pic,
                const uint32_t* const palette_sorted, uint32_t num_colors,
                uint32_t* const palette) {
  switch (method) {
    case kSortedDefault:
      if (palette_sorted[0] == 0 && num_colors > 17) {
        memcpy(palette, palette_sorted + 1,
               (num_colors - 1) * sizeof(*palette_sorted));
        palette[num_colors - 1] = 0;
      } else {
        memcpy(palette, palette_sorted, num_colors * sizeof(*palette));
      }
      return 1;
    case kMinimizeDelta:
      PaletteSortMinimizeDeltas(palette_sorted, num_colors, palette);
      return 1;
    case kModifiedZeng:
      return PaletteSortModifiedZeng(pic, palette_sorted, num_colors, palette);
    case kUnusedPalette:
    case kPaletteSortingNum:
      break;
  }

  assert(0);
  return 0;
}